

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_ObjAttrSize(Cba_Ntk_t *p,int i)

{
  int iVar1;
  int local_18;
  int i_local;
  Cba_Ntk_t *p_local;
  
  if (-1 < i) {
    iVar1 = Cba_ObjAttr(p,i);
    if (iVar1 == 0) {
      local_18 = 0;
    }
    else {
      iVar1 = Cba_ObjAttr(p,i);
      local_18 = Vec_IntEntry(&p->vAttrSto,iVar1);
    }
    return local_18;
  }
  __assert_fail("i>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                ,0xf3,"int Cba_ObjAttrSize(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_ObjAttrSize( Cba_Ntk_t * p, int i )         { assert(i>=0); return Cba_ObjAttr(p, i) ? Vec_IntEntry(&p->vAttrSto, Cba_ObjAttr(p, i)) : 0; }